

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result-c.cpp
# Opt level: O2

void duckdb::WriteData<unsigned_short,unsigned_short,duckdb::CStandardConverter>
               (duckdb_column *column,ColumnDataCollection *source,
               vector<unsigned_long,_true> *column_ids)

{
  void *pvVar1;
  data_ptr_t pdVar2;
  bool bVar3;
  DataChunk *this;
  reference pvVar4;
  idx_t k;
  ulong row_idx;
  long lVar5;
  ColumnDataChunkIterator __begin2;
  ColumnDataChunkIterator __end2;
  ColumnDataChunkIterationHelper local_1a8;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_188;
  ColumnDataChunkIterator local_170;
  ColumnDataChunkIterator local_d0;
  
  pvVar1 = column->deprecated_data;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188,
             &column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  ColumnDataCollection::Chunks(&local_1a8,source,(vector<unsigned_long,_true> *)&local_188);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_188);
  ColumnDataChunkIterationHelper::begin(&local_170,&local_1a8);
  ColumnDataChunkIterationHelper::end(&local_d0,&local_1a8);
  lVar5 = 0;
  while( true ) {
    bVar3 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator!=
                      (&local_170,&local_d0);
    if (!bVar3) break;
    this = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator*(&local_170);
    pvVar4 = vector<duckdb::Vector,_true>::get<true>(&this->data,0);
    pdVar2 = pvVar4->data;
    pvVar4 = vector<duckdb::Vector,_true>::get<true>(&this->data,0);
    FlatVector::VerifyFlatVector(pvVar4);
    for (row_idx = 0; row_idx < this->count; row_idx = row_idx + 1) {
      bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(pvVar4->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
      if (bVar3) {
        *(undefined2 *)((long)pvVar1 + row_idx * 2 + lVar5 * 2) =
             *(undefined2 *)(pdVar2 + row_idx * 2);
      }
    }
    lVar5 = lVar5 + row_idx;
    ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator++(&local_170);
  }
  ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator(&local_d0);
  ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator(&local_170);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1a8.column_ids);
  return;
}

Assistant:

void WriteData(duckdb_column *column, ColumnDataCollection &source, const vector<column_t> &column_ids) {
	idx_t row = 0;
	auto target = (DST *)column->deprecated_data;
	for (auto &input : source.Chunks(column_ids)) {
		auto source = FlatVector::GetData<SRC>(input.data[0]);
		auto &mask = FlatVector::Validity(input.data[0]);

		for (idx_t k = 0; k < input.size(); k++, row++) {
			if (!mask.RowIsValid(k)) {
				OP::template NullConvert<DST>(target[row]);
			} else {
				target[row] = OP::template Convert<SRC, DST>(source[k]);
			}
		}
	}
}